

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O0

int hello_world_object_impl_interface_set
              (object obj,object_impl impl,accessor_type *accessor,value v)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *message;
  undefined8 uVar4;
  undefined8 in_RCX;
  long in_RDX;
  undefined1 *in_RSI;
  AssertionResult gtest_ar;
  char *key;
  attribute attr;
  hello_world_object hello_world;
  void **in_stack_ffffffffffffff70;
  AssertionResult *this;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  AssertHelper in_stack_ffffffffffffff88;
  Message local_70 [3];
  undefined1 *local_58;
  undefined8 local_50;
  AssertionResult local_48;
  char *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 local_20;
  
  local_30 = *(undefined8 *)(in_RDX + 8);
  local_28 = in_RSI;
  local_20 = in_RCX;
  local_38 = (char *)attribute_name(local_30);
  local_50 = 0;
  local_58 = local_28;
  this = &local_48;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)in_stack_ffffffffffffff88.data_,
             (char *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),(void **)this,
             in_stack_ffffffffffffff70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this);
  if (!bVar1) {
    testing::Message::Message(local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x10be63);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0x58,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff88,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88);
    testing::Message::~Message((Message *)0x10beb1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bef1);
  iVar3 = strcmp(local_38,"d");
  if (iVar3 == 0) {
    uVar2 = value_to_char(local_20);
    *local_28 = uVar2;
  }
  else {
    iVar3 = strcmp(local_38,"e");
    if (iVar3 == 0) {
      uVar4 = value_to_long(local_20);
      *(undefined8 *)(local_28 + 8) = uVar4;
    }
  }
  return 0;
}

Assistant:

int hello_world_object_impl_interface_set(object obj, object_impl impl, struct accessor_type *accessor, value v)
{
	hello_world_object hello_world = (hello_world_object)impl;
	attribute attr = accessor->data.attr;
	const char *key = attribute_name(attr);

	EXPECT_NE((void *)NULL, (void *)hello_world);

	(void)obj;

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "d") == 0)
	{
		hello_world->d = value_to_char(v);
	}
	else if (strcmp(key, "e") == 0)
	{
		hello_world->e = value_to_long(v);
	}

	return 0;
}